

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O0

O3DGCErrorCode __thiscall o3dgc::CompressedTriangleFans::Clear(CompressedTriangleFans *this)

{
  CompressedTriangleFans *this_local;
  
  Vector<long>::Clear(&this->m_numTFANs);
  Vector<long>::Clear(&this->m_degrees);
  Vector<long>::Clear(&this->m_configs);
  Vector<long>::Clear(&this->m_operations);
  Vector<long>::Clear(&this->m_indices);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode              Clear()
                                    {
                                        m_numTFANs.Clear();
                                        m_degrees.Clear();
                                        m_configs.Clear();
                                        m_operations.Clear();
                                        m_indices.Clear();
                                        return O3DGC_OK;
                                    }